

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,ExpressionList *exp_list,void *data)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> _Var3;
  SyntaxTree *pSVar4;
  size_t i;
  long lVar5;
  long lVar6;
  ExpVarData exp_var_data;
  
  puVar1 = (exp_list->exp_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (exp_list->exp_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar6 = (long)puVar2 - (long)puVar1 >> 3;
    for (lVar5 = 0; lVar6 + -1 != lVar5; lVar5 = lVar5 + 1) {
      exp_var_data.semantic_op_ = SemanticOp_Read;
      exp_var_data.exp_type_ = ExpType_Unknown;
      exp_var_data.results_any_count_ = false;
      _Var3._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
           (exp_list->exp_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,this,&exp_var_data);
    }
    exp_var_data.semantic_op_ = SemanticOp_Read;
    exp_var_data.exp_type_ = ExpType_Unknown;
    exp_var_data.results_any_count_ = false;
    pSVar4 = (exp_list->exp_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar4->_vptr_SyntaxTree[2])(pSVar4,this,&exp_var_data);
    lVar5 = -1;
    if (exp_var_data.results_any_count_ == false) {
      lVar5 = lVar6;
    }
    *(int *)data = (int)lVar5;
    return;
  }
  __assert_fail("!exp_list->exp_list_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0x2d2,"virtual void luna::SemanticAnalysisVisitor::Visit(ExpressionList *, void *)"
               );
}

Assistant:

void SemanticAnalysisVisitor::Visit(ExpressionList *exp_list, void *data)
    {
        assert(!exp_list->exp_list_.empty());

        // Expressions in ExpressionList must be read semantic
        std::size_t size = exp_list->exp_list_.size() - 1;
        for (std::size_t i = 0; i < size; ++i)
        {
            ExpVarData exp_var_data{ SemanticOp_Read };
            exp_list->exp_list_[i]->Accept(this, &exp_var_data);
        }

        // If the last expression in list which has any count value results,
        // then this expression list has any count value results also
        ExpVarData exp_var_data{ SemanticOp_Read };
        exp_list->exp_list_.back()->Accept(this, &exp_var_data);
        int count = exp_var_data.results_any_count_ ? EXP_VALUE_COUNT_ANY : size + 1;
        static_cast<ExpListData *>(data)->exp_value_count_ = count;
    }